

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O2

Abc_Obj_t * Dec_GraphToNetwork(Abc_Ntk_t *pNtk,Dec_Graph_t *pGraph)

{
  uint uVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  Dec_Node_t *pDVar4;
  undefined1 *puVar5;
  ulong uVar6;
  long lVar7;
  
  if (pGraph->fConst == 0) {
    uVar6 = (ulong)(uint)pGraph->nLeaves;
    if (((uint)pGraph->eRoot >> 1 & 0x3fffffff) < (uint)pGraph->nLeaves) {
      pDVar4 = Dec_GraphVar(pGraph);
      pAVar3 = (Abc_Obj_t *)(pDVar4->field_2).pFunc;
    }
    else {
      lVar7 = uVar6 * 0x18;
      puVar5 = (undefined1 *)0x0;
      for (; (long)uVar6 < (long)pGraph->nSize; uVar6 = uVar6 + 1) {
        pDVar4 = pGraph->pNodes;
        puVar5 = &(pDVar4->eEdge0).field_0x0 + lVar7;
        uVar1 = *(uint *)(&(pDVar4->eEdge0).field_0x0 + lVar7);
        uVar2 = *(uint *)(&(pDVar4->eEdge1).field_0x0 + lVar7);
        pAVar3 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)(uVar1 & 1) ^
                            (ulong)pDVar4[uVar1 >> 1 & 0x3fffffff].field_2.pFunc),
                            (Abc_Obj_t *)
                            ((ulong)(uVar2 & 1) ^
                            (ulong)pDVar4[uVar2 >> 1 & 0x3fffffff].field_2.pFunc));
        *(Abc_Obj_t **)((long)&pDVar4->field_2 + lVar7) = pAVar3;
        lVar7 = lVar7 + 0x18;
      }
      pAVar3 = *(Abc_Obj_t **)(puVar5 + 8);
    }
  }
  else {
    pAVar3 = Abc_AigConst1(pNtk);
  }
  return (Abc_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pAVar3);
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description [AIG nodes for the fanins should be assigned to pNode->pFunc
  of the leaves of the graph before calling this procedure.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Obj_t * Dec_GraphToNetwork( Abc_Ntk_t * pNtk, Dec_Graph_t * pGraph )
{
    Abc_Obj_t * pAnd0, * pAnd1;
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i;
    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Abc_ObjNotCond( Abc_AigConst1(pNtk), Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Abc_ObjNotCond( (Abc_Obj_t *)Dec_GraphVar(pGraph)->pFunc, Dec_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Abc_ObjNotCond( (Abc_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Abc_ObjNotCond( (Abc_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Abc_ObjNotCond( (Abc_Obj_t *)pNode->pFunc, Dec_GraphIsComplement(pGraph) );
}